

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

sexp_conflict
sexp_make_variable_transformer_op
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict base_proc)

{
  byte bVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)base_proc & 3) == 0) && (base_proc->tag == 0x14)) {
    bVar1 = (base_proc->value).flonum_bits[0x10] >> 1;
    if ((bVar1 & 4) == 0) {
      psVar2 = (sexp_conflict)
               sexp_make_procedure_op
                         (ctx,0,4,(long)(char)bVar1 * 2 + 9,
                          (long)(base_proc->value).procedure.num_args * 2 + 1,
                          (base_proc->value).flonum,(base_proc->value).type.cpl);
      return psVar2;
    }
    return base_proc;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x14);
  return psVar2;
}

Assistant:

sexp sexp_make_variable_transformer_op (sexp ctx, sexp self, sexp_sint_t n, sexp base_proc) {
  sexp flags;
  sexp_assert_type(ctx, sexp_procedurep, SEXP_PROCEDURE, base_proc);
  if (sexp_procedure_variable_transformer_p(base_proc))
    return base_proc;
  flags = sexp_make_fixnum(sexp_unbox_fixnum(sexp_procedure_flags(base_proc)) | SEXP_PROC_VARIABLE_TRANSFORMER);
  return sexp_make_procedure(ctx, flags,
                             sexp_make_fixnum(sexp_procedure_num_args(base_proc)),
                             sexp_procedure_code(base_proc),
                             sexp_procedure_vars(base_proc));
}